

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall
Assimp::PretransformVertices::CollectData
          (PretransformVertices *this,aiScene *pcScene,aiNode *pcNode,uint iMat,uint iVFormat,
          aiMesh *pcMeshOut,uint *aiCurrent,uint *num_refs)

{
  aiMatrix4x4 *paVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  aiMesh *pcMesh;
  aiVector3D *paVar13;
  aiVector3D *paVar14;
  aiFace *paVar15;
  aiFace *paVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  long lVar21;
  aiMatrix4x4t<float> *paVar22;
  uint *puVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  aiMatrix4x4 mWorldIT;
  aiBone **ppaVar20;
  
  paVar1 = &pcNode->mTransformation;
  if (((((((0.01 < ABS((pcNode->mTransformation).a2)) || (0.01 < ABS((pcNode->mTransformation).a3)))
         || (0.01 < ABS((pcNode->mTransformation).a4))) ||
        ((0.01 < ABS((pcNode->mTransformation).b1) || (0.01 < ABS((pcNode->mTransformation).b3)))))
       || ((0.01 < ABS((pcNode->mTransformation).b4) ||
           ((0.01 < ABS((pcNode->mTransformation).c1) || (0.01 < ABS((pcNode->mTransformation).c2)))
           )))) || (0.01 < ABS((pcNode->mTransformation).c4))) ||
     (((0.01 < ABS((pcNode->mTransformation).d1) || (0.01 < ABS((pcNode->mTransformation).d2))) ||
      (0.01 < ABS((pcNode->mTransformation).d3))))) {
    bVar17 = false;
  }
  else {
    bVar17 = false;
    if ((paVar1->a1 <= 1.01) && (0.99 <= paVar1->a1)) {
      fVar3 = (pcNode->mTransformation).b2;
      bVar17 = false;
      if ((fVar3 <= 1.01) && (0.99 <= fVar3)) {
        fVar3 = (pcNode->mTransformation).c3;
        bVar17 = false;
        if ((fVar3 <= 1.01) && (0.99 <= fVar3)) {
          fVar3 = (pcNode->mTransformation).d4;
          if (fVar3 <= 1.01) {
            bVar17 = 0.99 <= fVar3;
          }
          else {
            bVar17 = false;
          }
        }
      }
    }
  }
  if (pcNode->mNumMeshes != 0) {
    uVar27 = 0;
    do {
      pcMesh = pcScene->mMeshes[pcNode->mMeshes[uVar27]];
      if (pcMesh->mMaterialIndex == iMat) {
        ppaVar20 = pcMesh->mBones;
        if (ppaVar20 == (aiBone **)0x0) {
          uVar18 = GetMeshVFormatUnique(pcMesh);
          ppaVar20 = (aiBone **)(ulong)uVar18;
          pcMesh->mBones = (aiBone **)(ulong)uVar18;
        }
        if ((uint)ppaVar20 == iVFormat) {
          uVar18 = pcNode->mMeshes[uVar27];
          if (num_refs[uVar18] == 0) {
            __assert_fail("0 != num_ref",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/PretransformVertices.cpp"
                          ,0xa7,
                          "void Assimp::PretransformVertices::CollectData(aiScene *, aiNode *, unsigned int, unsigned int, aiMesh *, unsigned int *, unsigned int *)"
                         );
          }
          uVar19 = num_refs[uVar18] - 1;
          num_refs[uVar18] = uVar19;
          if ((pcMesh != pcMeshOut) && (uVar19 == 0)) {
            uVar19 = (pcMesh->mName).length;
            (pcMeshOut->mName).length = uVar19;
            memcpy((pcMeshOut->mName).data,(pcMesh->mName).data,(ulong)uVar19);
            (pcMeshOut->mName).data[uVar19] = '\0';
          }
          if (bVar17) {
            memcpy(pcMeshOut->mVertices + *aiCurrent,pcMesh->mVertices,
                   (ulong)pcMesh->mNumVertices * 0xc);
            if ((iVFormat & 2) != 0) {
              memcpy(pcMeshOut->mNormals + *aiCurrent,pcMesh->mNormals,
                     (ulong)pcMesh->mNumVertices * 0xc);
            }
            if ((iVFormat & 4) != 0) {
              memcpy(pcMeshOut->mTangents + *aiCurrent,pcMesh->mTangents,
                     (ulong)pcMesh->mNumVertices * 0xc);
              memcpy(pcMeshOut->mBitangents + *aiCurrent,pcMesh->mBitangents,
                     (ulong)pcMesh->mNumVertices * 0xc);
            }
          }
          else {
            if (pcMesh->mNumVertices != 0) {
              lVar21 = 8;
              uVar28 = 0;
              do {
                paVar13 = pcMesh->mVertices;
                fVar3 = *(float *)((long)paVar13 + lVar21 + -8);
                fVar4 = *(float *)((long)paVar13 + lVar21 + -4);
                fVar5 = *(float *)((long)&paVar13->x + lVar21);
                fVar6 = (pcNode->mTransformation).b2;
                fVar7 = (pcNode->mTransformation).b1;
                fVar8 = (pcNode->mTransformation).b3;
                fVar9 = (pcNode->mTransformation).b4;
                fVar10 = (pcNode->mTransformation).c2;
                fVar11 = (pcNode->mTransformation).c1;
                fVar29 = (pcNode->mTransformation).c3;
                fVar32 = (pcNode->mTransformation).c4;
                paVar14 = pcMeshOut->mVertices;
                uVar19 = *aiCurrent + (int)uVar28;
                paVar13 = paVar14 + uVar19;
                paVar13->x = (pcNode->mTransformation).a3 * fVar5 +
                             (pcNode->mTransformation).a1 * fVar3 +
                             (pcNode->mTransformation).a2 * fVar4 + (pcNode->mTransformation).a4;
                paVar13->y = fVar8 * fVar5 + fVar7 * fVar3 + fVar6 * fVar4 + fVar9;
                paVar14[uVar19].z = fVar5 * fVar29 + fVar3 * fVar11 + fVar4 * fVar10 + fVar32;
                uVar28 = uVar28 + 1;
                lVar21 = lVar21 + 0xc;
              } while (uVar28 < pcMesh->mNumVertices);
            }
            mWorldIT.a1 = paVar1->a1;
            mWorldIT.a2 = paVar1->a2;
            mWorldIT.a3 = (pcNode->mTransformation).a3;
            mWorldIT.a4 = (pcNode->mTransformation).a4;
            mWorldIT.b1 = (pcNode->mTransformation).b1;
            mWorldIT.b2 = (pcNode->mTransformation).b2;
            mWorldIT.b3 = (pcNode->mTransformation).b3;
            mWorldIT.b4 = (pcNode->mTransformation).b4;
            mWorldIT.c1 = (pcNode->mTransformation).c1;
            mWorldIT.c2 = (pcNode->mTransformation).c2;
            mWorldIT.c3 = (pcNode->mTransformation).c3;
            mWorldIT.c4 = (pcNode->mTransformation).c4;
            mWorldIT.d1 = (pcNode->mTransformation).d1;
            mWorldIT.d2 = (pcNode->mTransformation).d2;
            mWorldIT.d3 = (pcNode->mTransformation).d3;
            mWorldIT.d4 = (pcNode->mTransformation).d4;
            paVar22 = aiMatrix4x4t<float>::Inverse(&mWorldIT);
            fVar3 = paVar22->b1;
            paVar22->b1 = paVar22->a2;
            paVar22->a2 = fVar3;
            fVar3 = paVar22->c1;
            paVar22->c1 = paVar22->a3;
            paVar22->a3 = fVar3;
            fVar3 = paVar22->c2;
            paVar22->c2 = paVar22->b3;
            paVar22->b3 = fVar3;
            fVar3 = paVar22->d1;
            paVar22->d1 = paVar22->a4;
            paVar22->a4 = fVar3;
            fVar3 = paVar22->d2;
            paVar22->d2 = paVar22->b4;
            paVar22->b4 = fVar3;
            fVar3 = paVar22->d3;
            paVar22->d3 = paVar22->c4;
            paVar22->c4 = fVar3;
            fVar3 = mWorldIT.a1;
            fVar4 = mWorldIT.a2;
            fVar5 = mWorldIT.a3;
            fVar6 = mWorldIT.b1;
            fVar7 = mWorldIT.b2;
            fVar8 = mWorldIT.b3;
            fVar9 = mWorldIT.c1;
            fVar10 = mWorldIT.c2;
            fVar11 = mWorldIT.c3;
            if (((iVFormat & 2) != 0) && (pcMesh->mNumVertices != 0)) {
              lVar21 = 8;
              uVar28 = 0;
              do {
                paVar13 = pcMesh->mNormals;
                fVar29 = *(float *)((long)paVar13 + lVar21 + -8);
                fVar32 = *(float *)((long)paVar13 + lVar21 + -4);
                fVar12 = *(float *)((long)&paVar13->x + lVar21);
                fVar31 = fVar5 * fVar12 + fVar3 * fVar29 + fVar4 * fVar32;
                fVar30 = fVar8 * fVar12 + fVar6 * fVar29 + fVar7 * fVar32;
                fVar32 = fVar12 * fVar11 + fVar29 * fVar9 + fVar32 * fVar10;
                fVar29 = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
                if (fVar29 < 0.0) {
                  fVar29 = sqrtf(fVar29);
                }
                else {
                  fVar29 = SQRT(fVar29);
                }
                fVar29 = 1.0 / fVar29;
                paVar14 = pcMeshOut->mNormals;
                uVar19 = *aiCurrent + (int)uVar28;
                paVar13 = paVar14 + uVar19;
                paVar13->x = fVar31 * fVar29;
                paVar13->y = fVar30 * fVar29;
                paVar14[uVar19].z = fVar29 * fVar32;
                uVar28 = uVar28 + 1;
                lVar21 = lVar21 + 0xc;
              } while (uVar28 < pcMesh->mNumVertices);
            }
            if (((iVFormat & 4) != 0) && (pcMesh->mNumVertices != 0)) {
              lVar21 = 8;
              uVar28 = 0;
              do {
                paVar13 = pcMesh->mTangents;
                fVar29 = *(float *)((long)paVar13 + lVar21 + -8);
                fVar32 = *(float *)((long)paVar13 + lVar21 + -4);
                fVar12 = *(float *)((long)&paVar13->x + lVar21);
                fVar31 = fVar5 * fVar12 + fVar3 * fVar29 + fVar4 * fVar32;
                fVar30 = fVar8 * fVar12 + fVar6 * fVar29 + fVar7 * fVar32;
                fVar32 = fVar12 * fVar11 + fVar29 * fVar9 + fVar32 * fVar10;
                fVar29 = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
                if (fVar29 < 0.0) {
                  fVar29 = sqrtf(fVar29);
                }
                else {
                  fVar29 = SQRT(fVar29);
                }
                fVar29 = 1.0 / fVar29;
                paVar14 = pcMeshOut->mTangents;
                uVar19 = *aiCurrent + (int)uVar28;
                paVar13 = paVar14 + uVar19;
                paVar13->x = fVar31 * fVar29;
                paVar13->y = fVar30 * fVar29;
                paVar14[uVar19].z = fVar29 * fVar32;
                paVar13 = pcMesh->mBitangents;
                fVar29 = *(float *)((long)paVar13 + lVar21 + -8);
                fVar32 = *(float *)((long)paVar13 + lVar21 + -4);
                fVar12 = *(float *)((long)&paVar13->x + lVar21);
                fVar31 = fVar5 * fVar12 + fVar3 * fVar29 + fVar4 * fVar32;
                fVar30 = fVar8 * fVar12 + fVar6 * fVar29 + fVar7 * fVar32;
                fVar32 = fVar12 * fVar11 + fVar29 * fVar9 + fVar32 * fVar10;
                fVar29 = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
                if (fVar29 < 0.0) {
                  fVar29 = sqrtf(fVar29);
                }
                else {
                  fVar29 = SQRT(fVar29);
                }
                fVar29 = 1.0 / fVar29;
                paVar14 = pcMeshOut->mBitangents;
                uVar19 = *aiCurrent + (int)uVar28;
                paVar13 = paVar14 + uVar19;
                paVar13->x = fVar31 * fVar29;
                paVar13->y = fVar30 * fVar29;
                paVar14[uVar19].z = fVar29 * fVar32;
                uVar28 = uVar28 + 1;
                lVar21 = lVar21 + 0xc;
              } while (uVar28 < pcMesh->mNumVertices);
            }
          }
          if ((iVFormat >> 8 & 1) != 0) {
            uVar28 = 0;
            do {
              memcpy(pcMeshOut->mTextureCoords[uVar28] + *aiCurrent,pcMesh->mTextureCoords[uVar28],
                     (ulong)pcMesh->mNumVertices * 0xc);
              uVar19 = (int)uVar28 + 1;
              uVar28 = (ulong)uVar19;
            } while (((iVFormat >> ((byte)uVar19 & 0x1f)) >> 8 & 1) != 0);
          }
          if ((iVFormat >> 0x18 & 1) != 0) {
            uVar28 = 0;
            do {
              memcpy(pcMeshOut->mColors[uVar28] + *aiCurrent,pcMesh->mColors[uVar28],
                     (ulong)pcMesh->mNumVertices << 4);
              uVar19 = (int)uVar28 + 1;
              uVar28 = (ulong)uVar19;
            } while (((iVFormat >> ((byte)uVar19 & 0x1f)) >> 0x18 & 1) != 0);
          }
          if (pcMesh->mNumFaces != 0) {
            uVar28 = 0;
            do {
              paVar15 = pcMesh->mFaces;
              paVar16 = pcMeshOut->mFaces;
              uVar19 = aiCurrent[1] + (int)uVar28;
              uVar26 = (ulong)paVar15[uVar28].mNumIndices;
              paVar16[uVar19].mNumIndices = paVar15[uVar28].mNumIndices;
              if (num_refs[uVar18] == 0) {
                puVar23 = paVar15[uVar28].mIndices;
                paVar16[uVar19].mIndices = puVar23;
                if (uVar26 != 0) {
                  uVar25 = 0;
                  do {
                    puVar2 = puVar23 + uVar25;
                    *puVar2 = *puVar2 + *aiCurrent;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
              }
              else {
                puVar23 = (uint *)operator_new__(uVar26 * 4);
                paVar16[uVar19].mIndices = puVar23;
                if (uVar26 != 0) {
                  uVar19 = *aiCurrent;
                  uVar25 = 0;
                  do {
                    puVar23[uVar25] = paVar15[uVar28].mIndices[uVar25] + uVar19;
                    uVar25 = uVar25 + 1;
                  } while (uVar26 != uVar25);
                }
              }
              uVar24 = pcMesh->mFaces[uVar28].mNumIndices - 1;
              uVar19 = 8;
              if (uVar24 < 3) {
                uVar19 = *(uint *)(&DAT_006b2970 + (ulong)uVar24 * 4);
              }
              pcMeshOut->mPrimitiveTypes = pcMeshOut->mPrimitiveTypes | uVar19;
              uVar28 = uVar28 + 1;
            } while (uVar28 < pcMesh->mNumFaces);
          }
          *aiCurrent = *aiCurrent + pcMesh->mNumVertices;
          aiCurrent[1] = aiCurrent[1] + pcMesh->mNumFaces;
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < pcNode->mNumMeshes);
  }
  if (pcNode->mNumChildren != 0) {
    uVar27 = 0;
    do {
      CollectData(this,pcScene,pcNode->mChildren[uVar27],iMat,iVFormat,pcMeshOut,aiCurrent,num_refs)
      ;
      uVar27 = uVar27 + 1;
    } while (uVar27 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::CollectData( aiScene* pcScene, aiNode* pcNode, unsigned int iMat,
    unsigned int iVFormat, aiMesh* pcMeshOut,
    unsigned int aiCurrent[2], unsigned int* num_refs)
{
    // No need to multiply if there's no transformation
    const bool identity = pcNode->mTransformation.IsIdentity();
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ pcNode->mMeshes[i] ];
        if (iMat == pcMesh->mMaterialIndex && iVFormat == GetMeshVFormat(pcMesh))
        {
            // Decrement mesh reference counter
            unsigned int& num_ref = num_refs[pcNode->mMeshes[i]];
            ai_assert(0 != num_ref);
            --num_ref;
            // Save the name of the last mesh
            if (num_ref==0)
            {
                pcMeshOut->mName = pcMesh->mName;
            }

            if (identity)   {
                // copy positions without modifying them
                ::memcpy(pcMeshOut->mVertices + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mVertices,
                    pcMesh->mNumVertices * sizeof(aiVector3D));

                if (iVFormat & 0x2) {
                    // copy normals without modifying them
                    ::memcpy(pcMeshOut->mNormals + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mNormals,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents without modifying them
                    ::memcpy(pcMeshOut->mTangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mTangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                    // copy bitangents without modifying them
                    ::memcpy(pcMeshOut->mBitangents + aiCurrent[AI_PTVS_VERTEX],
                        pcMesh->mBitangents,
                        pcMesh->mNumVertices * sizeof(aiVector3D));
                }
            }
            else
            {
                // copy positions, transform them to worldspace
                for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                    pcMeshOut->mVertices[aiCurrent[AI_PTVS_VERTEX]+n] = pcNode->mTransformation * pcMesh->mVertices[n];
                }
                aiMatrix4x4 mWorldIT = pcNode->mTransformation;
                mWorldIT.Inverse().Transpose();

                // TODO: implement Inverse() for aiMatrix3x3
                aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

                if (iVFormat & 0x2)
                {
                    // copy normals, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mNormals[aiCurrent[AI_PTVS_VERTEX]+n] =
                            (m * pcMesh->mNormals[n]).Normalize();
                    }
                }
                if (iVFormat & 0x4)
                {
                    // copy tangents and bitangents, transform them to worldspace
                    for (unsigned int n = 0; n < pcMesh->mNumVertices;++n)  {
                        pcMeshOut->mTangents  [aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mTangents[n]).Normalize();
                        pcMeshOut->mBitangents[aiCurrent[AI_PTVS_VERTEX]+n] = (m * pcMesh->mBitangents[n]).Normalize();
                    }
                }
            }
            unsigned int p = 0;
            while (iVFormat & (0x100 << p))
            {
                // copy texture coordinates
                memcpy(pcMeshOut->mTextureCoords[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mTextureCoords[p],
                    pcMesh->mNumVertices * sizeof(aiVector3D));
                ++p;
            }
            p = 0;
            while (iVFormat & (0x1000000 << p))
            {
                // copy vertex colors
                memcpy(pcMeshOut->mColors[p] + aiCurrent[AI_PTVS_VERTEX],
                    pcMesh->mColors[p],
                    pcMesh->mNumVertices * sizeof(aiColor4D));
                ++p;
            }
            // now we need to copy all faces. since we will delete the source mesh afterwards,
            // we don't need to reallocate the array of indices except if this mesh is
            // referenced multiple times.
            for (unsigned int planck = 0;planck < pcMesh->mNumFaces;++planck)
            {
                aiFace& f_src = pcMesh->mFaces[planck];
                aiFace& f_dst = pcMeshOut->mFaces[aiCurrent[AI_PTVS_FACE]+planck];

                const unsigned int num_idx = f_src.mNumIndices;

                f_dst.mNumIndices = num_idx;

                unsigned int* pi;
                if (!num_ref) { /* if last time the mesh is referenced -> no reallocation */
                    pi = f_dst.mIndices = f_src.mIndices;

                    // offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] += aiCurrent[AI_PTVS_VERTEX];
                    }
                }
                else {
                    pi = f_dst.mIndices = new unsigned int[num_idx];

                    // copy and offset all vertex indices
                    for (unsigned int hahn = 0; hahn < num_idx;++hahn){
                        pi[hahn] = f_src.mIndices[hahn] + aiCurrent[AI_PTVS_VERTEX];
                    }
                }

                // Update the mPrimitiveTypes member of the mesh
                switch (pcMesh->mFaces[planck].mNumIndices)
                {
                case 0x1:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 0x2:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 0x3:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMeshOut->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                };
            }
            aiCurrent[AI_PTVS_VERTEX] += pcMesh->mNumVertices;
            aiCurrent[AI_PTVS_FACE]   += pcMesh->mNumFaces;
        }
    }

    // append all children of us
    for (unsigned int i = 0;i < pcNode->mNumChildren;++i) {
        CollectData(pcScene,pcNode->mChildren[i],iMat,
            iVFormat,pcMeshOut,aiCurrent,num_refs);
    }
}